

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

bool __thiscall
HighsMipSolverData::rootSeparationRound
          (HighsMipSolverData *this,HighsSeparation *sepa,HighsInt *ncuts,Status *status)

{
  HighsInt HVar1;
  Status SVar2;
  long lVar3;
  bool bVar4;
  
  lVar3 = (this->lp).numlpiters;
  HVar1 = HighsSeparation::separationRound(sepa,&this->domain,status);
  *ncuts = HVar1;
  lVar3 = (this->lp).numlpiters - lVar3;
  this->avgrootlpiters = (this->lp).avgSolveIters;
  this->total_lp_iterations = this->total_lp_iterations + lVar3;
  this->sepa_lp_iterations = this->sepa_lp_iterations + lVar3;
  SVar2 = evaluateRootLp(this);
  *status = SVar2;
  bVar4 = true;
  if (SVar2 != kInfeasible) {
    if ((this->mipsolver->submip != false) ||
       ((this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      HighsPrimalHeuristics::randomizedRounding
                (&this->heuristics,&(this->lp).lpsolver.solution_.col_value);
      HighsPrimalHeuristics::flushStatistics(&this->heuristics);
      SVar2 = evaluateRootLp(this);
      *status = SVar2;
      if (SVar2 == kInfeasible) {
        return true;
      }
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool HighsMipSolverData::rootSeparationRound(
    HighsSeparation& sepa, HighsInt& ncuts, HighsLpRelaxation::Status& status) {
  int64_t tmpLpIters = -lp.getNumLpIterations();
  ncuts = sepa.separationRound(domain, status);
  tmpLpIters += lp.getNumLpIterations();
  avgrootlpiters = lp.getAvgSolveIters();
  total_lp_iterations += tmpLpIters;
  sepa_lp_iterations += tmpLpIters;

  status = evaluateRootLp();
  if (status == HighsLpRelaxation::Status::kInfeasible) return true;

  const std::vector<double>& solvals = lp.getLpSolver().getSolution().col_value;

  if (mipsolver.submip || incumbent.empty()) {
    heuristics.randomizedRounding(solvals);
    heuristics.flushStatistics();
    status = evaluateRootLp();
    if (status == HighsLpRelaxation::Status::kInfeasible) return true;
  }

  return false;
}